

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::change_dxt1_to_dxt1a(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  mip_level *pmVar2;
  component_flags cVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->m_format == PIXEL_FMT_DXT1) {
    this->m_format = PIXEL_FMT_DXT1A;
    cVar3 = pixel_format_helpers::get_component_flags(PIXEL_FMT_DXT1A);
    this->m_comp_flags = cVar3;
    if ((this->m_faces).m_size != 0) {
      uVar5 = 0;
      do {
        pvVar1 = (this->m_faces).m_p;
        if (pvVar1[uVar5].m_size != 0) {
          uVar4 = 0;
          do {
            pmVar2 = pvVar1[uVar5].m_p[uVar4];
            if (pmVar2->m_pDXTImage != (dxt_image *)0x0) {
              pmVar2->m_format = this->m_format;
              pmVar2->m_comp_flags = this->m_comp_flags;
              dxt_image::change_dxt1_to_dxt1a(pmVar2->m_pDXTImage);
            }
            uVar4 = uVar4 + 1;
            pvVar1 = (this->m_faces).m_p;
          } while (uVar4 < pvVar1[uVar5].m_size);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->m_faces).m_size);
    }
  }
  return;
}

Assistant:

void mipmapped_texture::change_dxt1_to_dxt1a() {
  if (m_format != PIXEL_FMT_DXT1)
    return;

  m_format = PIXEL_FMT_DXT1A;

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  for (uint f = 0; f < m_faces.size(); f++) {
    for (uint l = 0; l < m_faces[f].size(); l++) {
      if (m_faces[f][l]->get_dxt_image()) {
        m_faces[f][l]->set_format(m_format);
        m_faces[f][l]->set_comp_flags(m_comp_flags);

        m_faces[f][l]->get_dxt_image()->change_dxt1_to_dxt1a();
      }
    }
  }
}